

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O2

sat_solver * Pdr_ManFetchSolver(Pdr_Man_t *p,int k)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  sat_solver *s;
  Pdr_Set_t *pCube;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)k;
  s = Pdr_ManSolver(p,k);
  iVar1 = Vec_IntEntry(p->vActVars,k);
  if (p->pPars->nRecycle <= iVar1) {
    if (p->vSolvers->nSize + -1 <= k) {
      __assert_fail("k < Vec_PtrSize(p->vSolvers) - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                    ,0x55,"sat_solver *Pdr_ManFetchSolver(Pdr_Man_t *, int)");
    }
    p->nStarts = p->nStarts + 1;
    sat_solver_restart(s);
    s = Pdr_ManNewSolver(s,p,k,(uint)(k == 0));
    if ((k < 0) || (p->vSolvers->nSize <= k)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    p->vSolvers->pArray[uVar2] = s;
    if (p->vActVars->nSize <= k) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    p->vActVars->pArray[uVar2] = 0;
    Pdr_ManSetPropertyOutput(p,k);
    for (; (int)uVar2 < p->vClauses->nSize; uVar2 = uVar2 + 1) {
      p_00 = (Vec_Ptr_t *)p->vClauses->pArray[uVar2];
      for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
        pCube = (Pdr_Set_t *)Vec_PtrEntry(p_00,iVar1);
        Pdr_ManSolverAddClause(p,k,pCube);
      }
    }
  }
  return s;
}

Assistant:

sat_solver * Pdr_ManFetchSolver( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;
    pSat = Pdr_ManSolver(p, k);
    if ( Vec_IntEntry(p->vActVars, k) < p->pPars->nRecycle )
        return pSat;
    assert( k < Vec_PtrSize(p->vSolvers) - 1 );
    p->nStarts++;
//    sat_solver_delete( pSat );
//    pSat = sat_solver_new();
    sat_solver_restart( pSat );
    // create new SAT solver
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    // write new SAT solver
    Vec_PtrWriteEntry( p->vSolvers, k, pSat );
    Vec_IntWriteEntry( p->vActVars, k, 0 );
    // set the property output
    Pdr_ManSetPropertyOutput( p, k );
    // add the clauses
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, k )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
            Pdr_ManSolverAddClause( p, k, pCube );
    return pSat;
}